

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiletime_evaluation.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  ct_variable<1UL> *rhs;
  ct_variable<1UL> *rhs_00;
  ct_variable<0UL> *rhs_01;
  ct_variable<2UL> *rhs_02;
  ct_constant<5L> *rhs_03;
  ct_constant<7L> *rhs_04;
  ct_variable<2UL> *rhs_05;
  ct_constant<5L> *rhs_06;
  ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_constant<5L>_>
  *rhs_07;
  ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<1UL>,_viennamath::op_div<double>,_viennamath::ct_variable<2UL>_>,_viennamath::op_plus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_constant<5L>_>_>
  *rhs_08;
  ct_constant<5L> *rhs_09;
  ct_constant<7L> *rhs_10;
  ct_constant<7L> *rhs_11;
  ct_binary_expr<viennamath::ct_variable<2UL>,_viennamath::op_plus<double>,_viennamath::ct_constant<7L>_>
  *rhs_12;
  ct_constant<5L> *rhs_13;
  ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_constant<5L>_>
  *rhs_14;
  ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<1UL>,_viennamath::op_div<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<2UL>,_viennamath::op_plus<double>,_viennamath::ct_constant<7L>_>_>,_viennamath::op_plus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_constant<5L>_>_>
  *rhs_15;
  ct_binary_expr<viennamath::ct_variable<1UL>,_viennamath::op_div<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<2UL>,_viennamath::op_plus<double>,_viennamath::ct_constant<7L>_>_>
  local_6c [2];
  ct_variable<1UL> local_65 [2];
  undefined1 local_63 [13];
  undefined1 local_56 [5];
  ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_plus<double>,_viennamath::ct_constant<5L>_>,_viennamath::op_div<double>,_viennamath::ct_constant<7L>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<1UL>,_viennamath::op_div<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<2UL>,_viennamath::op_plus<double>,_viennamath::ct_constant<7L>_>_>,_viennamath::op_plus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_constant<5L>_>_>_>
  local_51 [2];
  ct_binary_expr<viennamath::ct_variable<1UL>,_viennamath::op_div<double>,_viennamath::ct_variable<2UL>_>
  local_3c [2];
  undefined1 local_38 [11];
  undefined1 local_2d [5];
  ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_plus<double>,_viennamath::ct_constant<5L>_>,_viennamath::op_div<double>,_viennamath::ct_constant<7L>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<1UL>,_viennamath::op_div<double>,_viennamath::ct_variable<2UL>_>,_viennamath::op_plus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_constant<5L>_>_>_>
  local_28;
  ct_binary_expr<viennamath::ct_constant<7L>,_viennamath::op_minus<double>,_viennamath::ct_variable<2UL>_>
  local_1f [2];
  ct_binary_expr<viennamath::ct_constant<5L>,_viennamath::op_div<double>,_viennamath::ct_variable<0UL>_>
  local_1b [2];
  ct_binary_expr<viennamath::ct_variable<2UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<1UL>_>
  local_17 [2];
  ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_plus<double>,_viennamath::ct_variable<1UL>_>
  local_13;
  undefined1 local_11 [2];
  undefined1 local_f;
  undefined1 local_e;
  undefined1 local_d [4];
  ct_constant<7L> c7;
  ct_constant<5L> c5;
  ct_variable<2UL> z;
  ct_variable<1UL> y;
  ct_variable<0UL> x;
  
  stack0xfffffffffffffff4 = 0;
  viennamath::ct_variable<0UL>::ct_variable((ct_variable<0UL> *)local_d);
  viennamath::ct_variable<1UL>::ct_variable((ct_variable<1UL> *)&local_e);
  viennamath::ct_variable<2UL>::ct_variable((ct_variable<2UL> *)&local_f);
  viennamath::ct_constant<5L>::ct_constant((ct_constant<5L> *)(local_11 + 1));
  viennamath::ct_constant<7L>::ct_constant((ct_constant<7L> *)local_11);
  poVar1 = std::operator<<((ostream *)&std::cout,"--- Involved types ---");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"x: ");
  poVar1 = viennamath::operator<<(poVar1,(ct_variable<0UL> *)local_d);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"y: ");
  poVar1 = viennamath::operator<<(poVar1,(ct_variable<1UL> *)&local_e);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"z: ");
  poVar1 = viennamath::operator<<(poVar1,(ct_variable<2UL> *)&local_f);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"c5: ");
  poVar1 = viennamath::operator<<(poVar1,(ct_constant<5L> *)(local_11 + 1));
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"c7: ");
  poVar1 = viennamath::operator<<(poVar1,(ct_constant<7L> *)local_11);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"--- Various expressions: ---");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  operations_test<viennamath::ct_variable<0ul>>((ct_variable<0UL> *)local_d);
  operations_test<viennamath::ct_constant<5l>>((ct_constant<5L> *)(local_11 + 1));
  operations_test<viennamath::ct_constant<7l>>((ct_constant<7L> *)local_11);
  viennamath::operator+((type *)local_d,(ct_variable<0UL> *)&local_e,rhs);
  operations_test<viennamath::ct_binary_expr<viennamath::ct_variable<0ul>,viennamath::op_plus<double>,viennamath::ct_variable<1ul>>>
            (&local_13);
  viennamath::operator*((type *)&local_f,(ct_variable<2UL> *)&local_e,rhs_00);
  operations_test<viennamath::ct_binary_expr<viennamath::ct_variable<2ul>,viennamath::op_mult<double>,viennamath::ct_variable<1ul>>>
            (local_17);
  viennamath::operator/((type *)(local_11 + 1),(ct_constant<5L> *)local_d,rhs_01);
  operations_test<viennamath::ct_binary_expr<viennamath::ct_constant<5l>,viennamath::op_div<double>,viennamath::ct_variable<0ul>>>
            (local_1b);
  viennamath::operator-((type *)local_11,(ct_constant<7L> *)&local_f,rhs_02);
  operations_test<viennamath::ct_binary_expr<viennamath::ct_constant<7l>,viennamath::op_minus<double>,viennamath::ct_variable<2ul>>>
            (local_1f);
  viennamath::operator+((type *)local_d,(ct_variable<0UL> *)(local_11 + 1),rhs_03);
  viennamath::operator/
            ((type *)local_2d,
             (ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_plus<double>,_viennamath::ct_constant<5L>_>
              *)local_11,rhs_04);
  viennamath::operator/((type *)&local_e,(ct_variable<1UL> *)&local_f,rhs_05);
  viennamath::operator*((type *)local_d,(ct_variable<0UL> *)(local_11 + 1),rhs_06);
  viennamath::operator+((type *)local_38,local_3c,rhs_07);
  viennamath::operator-
            ((type *)(local_2d + 2),
             (ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_plus<double>,_viennamath::ct_constant<5L>_>,_viennamath::op_div<double>,_viennamath::ct_constant<7L>_>
              *)(local_38 + 2),rhs_08);
  operations_test<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0ul>,viennamath::op_plus<double>,viennamath::ct_constant<5l>>,viennamath::op_div<double>,viennamath::ct_constant<7l>>,viennamath::op_minus<double>,viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<1ul>,viennamath::op_div<double>,viennamath::ct_variable<2ul>>,viennamath::op_plus<double>,viennamath::ct_binary_expr<viennamath::ct_variable<0ul>,viennamath::op_mult<double>,viennamath::ct_constant<5l>>>>>
            (&local_28);
  viennamath::operator+((type *)local_d,(ct_variable<0UL> *)(local_11 + 1),rhs_09);
  viennamath::operator/
            ((type *)local_56,
             (ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_plus<double>,_viennamath::ct_constant<5L>_>
              *)local_11,rhs_10);
  viennamath::operator+((type *)&local_f,(ct_variable<2UL> *)local_11,rhs_11);
  viennamath::operator/((type *)&local_e,local_65,rhs_12);
  viennamath::operator*((type *)local_d,(ct_variable<0UL> *)(local_11 + 1),rhs_13);
  viennamath::operator+((type *)local_63,local_6c,rhs_14);
  viennamath::operator-
            ((type *)(local_56 + 2),
             (ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_plus<double>,_viennamath::ct_constant<5L>_>,_viennamath::op_div<double>,_viennamath::ct_constant<7L>_>
              *)(local_63 + 3),rhs_15);
  operations_test<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0ul>,viennamath::op_plus<double>,viennamath::ct_constant<5l>>,viennamath::op_div<double>,viennamath::ct_constant<7l>>,viennamath::op_minus<double>,viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<1ul>,viennamath::op_div<double>,viennamath::ct_binary_expr<viennamath::ct_variable<2ul>,viennamath::op_plus<double>,viennamath::ct_constant<7l>>>,viennamath::op_plus<double>,viennamath::ct_binary_expr<viennamath::ct_variable<0ul>,viennamath::op_mult<double>,viennamath::ct_constant<5l>>>>>
            (local_51);
  poVar1 = std::operator<<((ostream *)&std::cout,"************************************************")
  ;
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"*****     TEST COMPLETED SUCCESSFULLY!     *****")
  ;
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"************************************************")
  ;
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main()
{
  viennamath::ct_variable<0> x;
  viennamath::ct_variable<1> y;
  viennamath::ct_variable<2> z;
  viennamath::ct_constant<5> c5;
  viennamath::ct_constant<7> c7;


  std::cout << "--- Involved types ---" << std::endl;
  std::cout << "x: " << x << std::endl;
  std::cout << "y: " << y << std::endl;
  std::cout << "z: " << z << std::endl;
  std::cout << "c5: " << c5 << std::endl;
  std::cout << "c7: " << c7 << std::endl;

  std::cout << "--- Various expressions: ---" << std::endl;
  operations_test(x);
  operations_test(c5);
  operations_test(c7);
  operations_test(x + y);
  operations_test(z * y);
  operations_test(c5 / x);
  operations_test(c7 - z);


  //complicated beast:
  // (4 + 5) / 7 - (6 / 8 + 4 * 5)
  // = 9 / 7 - (20 + 6 / 8)
  // = 9 / 7 - 166 / 8
  // = (9*8 - 166 * 7) / 56
  // = (72 -  1162) / 56
  operations_test( (x + c5) / c7 - (y / z + x * c5) );

  operations_test( (x + c5) / c7 - (y / (z + c7) + x * c5) );

  std::cout << "************************************************" << std::endl;
  std::cout << "*****     TEST COMPLETED SUCCESSFULLY!     *****" << std::endl;
  std::cout << "************************************************" << std::endl;

  return EXIT_SUCCESS;
}